

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# containers.h
# Opt level: O0

void __thiscall
pbrt::
HashMap<pbrt::Light,_unsigned_int,_std::hash<pbrt::Light>,_pstd::pmr::polymorphic_allocator<pstd::optional<std::pair<pbrt::Light,_unsigned_int>_>_>_>
::Insert(HashMap<pbrt::Light,_unsigned_int,_std::hash<pbrt::Light>,_pstd::pmr::polymorphic_allocator<pstd::optional<std::pair<pbrt::Light,_unsigned_int>_>_>_>
         *this,Light *key,uint *value)

{
  bool bVar1;
  reference this_00;
  memory_resource *pmVar2;
  optional<std::pair<pbrt::Light,_unsigned_int>_> *poVar3;
  vector<pstd::optional<std::pair<pbrt::Light,_unsigned_int>_>,_pstd::pmr::polymorphic_allocator<pstd::optional<std::pair<pbrt::Light,_unsigned_int>_>_>_>
  *in_RDI;
  Light *in_stack_00000008;
  HashMap<pbrt::Light,_unsigned_int,_std::hash<pbrt::Light>,_pstd::pmr::polymorphic_allocator<pstd::optional<std::pair<pbrt::Light,_unsigned_int>_>_>_>
  *in_stack_00000010;
  size_t offset;
  HashMap<pbrt::Light,_unsigned_int,_std::hash<pbrt::Light>,_pstd::pmr::polymorphic_allocator<pstd::optional<std::pair<pbrt::Light,_unsigned_int>_>_>_>
  *in_stack_00000060;
  pair<pbrt::Light,_unsigned_int> *in_stack_ffffffffffffffb8;
  optional<std::pair<pbrt::Light,_unsigned_int>_> *in_stack_ffffffffffffffc0;
  size_type local_20;
  
  local_20 = FindOffset(in_stack_00000010,in_stack_00000008);
  this_00 = pstd::
            vector<pstd::optional<std::pair<pbrt::Light,_unsigned_int>_>,_pstd::pmr::polymorphic_allocator<pstd::optional<std::pair<pbrt::Light,_unsigned_int>_>_>_>
            ::operator[](in_RDI,local_20);
  bVar1 = pstd::optional<std::pair<pbrt::Light,_unsigned_int>_>::has_value(this_00);
  if (!bVar1) {
    pmVar2 = (memory_resource *)((long)&(in_RDI[1].alloc.memoryResource)->_vptr_memory_resource + 1)
    ;
    in_RDI[1].alloc.memoryResource = pmVar2;
    in_stack_ffffffffffffffc0 =
         (optional<std::pair<pbrt::Light,_unsigned_int>_> *)((long)pmVar2 * 3);
    poVar3 = (optional<std::pair<pbrt::Light,_unsigned_int>_> *)
             capacity((HashMap<pbrt::Light,_unsigned_int,_std::hash<pbrt::Light>,_pstd::pmr::polymorphic_allocator<pstd::optional<std::pair<pbrt::Light,_unsigned_int>_>_>_>
                       *)0x8eb69c);
    if (poVar3 < in_stack_ffffffffffffffc0) {
      Grow(in_stack_00000060);
      local_20 = FindOffset(in_stack_00000010,in_stack_00000008);
    }
  }
  std::make_pair<pbrt::Light_const&,unsigned_int_const&>
            ((Light *)in_RDI,(uint *)in_stack_ffffffffffffffc0);
  pstd::
  vector<pstd::optional<std::pair<pbrt::Light,_unsigned_int>_>,_pstd::pmr::polymorphic_allocator<pstd::optional<std::pair<pbrt::Light,_unsigned_int>_>_>_>
  ::operator[](in_RDI,local_20);
  pstd::optional<std::pair<pbrt::Light,_unsigned_int>_>::operator=
            (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  return;
}

Assistant:

void Insert(const Key &key, const Value &value) {
        size_t offset = FindOffset(key);
        if (table[offset].has_value() == false) {
            // Grow hash table if it is too full
            if (3 * ++nStored > capacity()) {
                Grow();
                offset = FindOffset(key);
            }
        }
        table[offset] = std::make_pair(key, value);
    }